

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * __thiscall
kratos::ast_type_to_string_abi_cxx11_(string *__return_storage_ptr__,kratos *this,IRNodeKind kind)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if ((int)this == 1) {
    __s = "Variable";
    __a = &local_12;
  }
  else if ((int)this == 2) {
    __s = "Statement";
    __a = &local_13;
  }
  else {
    __s = "Generator";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string ast_type_to_string(IRNodeKind kind) {
    if (kind == IRNodeKind::StmtKind)
        return "Statement";
    else if (kind == IRNodeKind::VarKind)
        return "Variable";
    else
        return "Generator";
}